

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_maddv_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  fpr_t *pfVar6;
  fpr_t *pfVar7;
  fpr_t *pfVar8;
  undefined1 auVar9 [16];
  byte bVar16;
  ushort uVar17;
  byte bVar26;
  ushort uVar27;
  byte bVar28;
  ushort uVar29;
  ushort uVar32;
  int iVar30;
  byte bVar31;
  ushort uVar33;
  ushort uVar35;
  ushort uVar37;
  undefined1 auVar18 [16];
  ushort uVar34;
  ushort uVar36;
  ushort uVar38;
  ushort uVar39;
  fpr_t fVar25;
  short sVar40;
  undefined1 auVar47 [16];
  short sVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar41;
  undefined6 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [14];
  undefined1 auVar46 [16];
  undefined4 uVar51;
  undefined6 uVar52;
  undefined8 uVar53;
  undefined1 auVar54 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [16];
  
  if (df < 4) {
    pfVar6 = (env->active_fpu).fpr + wd;
    pfVar7 = (env->active_fpu).fpr + ws;
    pfVar8 = (env->active_fpu).fpr + wt;
    switch(df) {
    case 0:
      auVar1 = *(undefined1 (*) [16])&pfVar7->fd;
      auVar47 = *(undefined1 (*) [16])&pfVar8->fd;
      sVar40 = CONCAT11(auVar1[8],auVar1[8]);
      uVar41 = CONCAT13(auVar1[9],CONCAT12(auVar1[9],sVar40));
      uVar42 = CONCAT15(auVar1[10],CONCAT14(auVar1[10],uVar41));
      uVar43 = CONCAT17(auVar1[0xb],CONCAT16(auVar1[0xb],uVar42));
      auVar44._0_10_ = CONCAT19(auVar1[0xc],CONCAT18(auVar1[0xc],uVar43));
      auVar44[10] = auVar1[0xd];
      auVar44[0xb] = auVar1[0xd];
      auVar45[0xc] = auVar1[0xe];
      auVar45._0_12_ = auVar44;
      auVar45[0xd] = auVar1[0xe];
      auVar46[0xf] = auVar1[0xf];
      auVar46[0xe] = auVar46[0xf];
      auVar46._0_14_ = auVar45;
      sVar48 = CONCAT11(auVar47[8],auVar47[8]);
      uVar51 = CONCAT13(auVar47[9],CONCAT12(auVar47[9],sVar48));
      uVar52 = CONCAT15(auVar47[10],CONCAT14(auVar47[10],uVar51));
      uVar53 = CONCAT17(auVar47[0xb],CONCAT16(auVar47[0xb],uVar52));
      auVar54._0_10_ = CONCAT19(auVar47[0xc],CONCAT18(auVar47[0xc],uVar53));
      auVar54[10] = auVar47[0xd];
      auVar54[0xb] = auVar47[0xd];
      auVar55[0xc] = auVar47[0xe];
      auVar55._0_12_ = auVar54;
      auVar55[0xd] = auVar47[0xe];
      auVar56[0xf] = auVar47[0xf];
      auVar56[0xe] = auVar56[0xf];
      auVar56._0_14_ = auVar55;
      uVar49 = sVar48 * sVar40;
      uVar57 = (short)((uint)uVar51 >> 0x10) * (short)((uint)uVar41 >> 0x10);
      uVar59 = (short)((uint6)uVar52 >> 0x20) * (short)((uint6)uVar42 >> 0x20);
      uVar61 = (short)((ulong)uVar53 >> 0x30) * (short)((ulong)uVar43 >> 0x30);
      uVar63 = (short)((unkuint10)auVar54._0_10_ >> 0x40) *
               (short)((unkuint10)auVar44._0_10_ >> 0x40);
      uVar65 = auVar54._10_2_ * auVar44._10_2_;
      uVar67 = auVar55._12_2_ * auVar45._12_2_;
      uVar69 = auVar56._14_2_ * auVar46._14_2_;
      uVar50 = uVar49 & 0xff;
      uVar58 = uVar57 & 0xff;
      uVar60 = uVar59 & 0xff;
      uVar62 = uVar61 & 0xff;
      uVar64 = uVar63 & 0xff;
      uVar66 = uVar65 & 0xff;
      uVar68 = uVar67 & 0xff;
      uVar70 = uVar69 & 0xff;
      auVar15._0_14_ = auVar1._0_14_;
      auVar15[0xe] = auVar1[7];
      auVar15[0xf] = auVar1[7];
      auVar14._14_2_ = auVar15._14_2_;
      auVar14._0_13_ = auVar1._0_13_;
      auVar14[0xd] = auVar1[6];
      auVar13._13_3_ = auVar14._13_3_;
      auVar13._0_12_ = auVar1._0_12_;
      auVar13[0xc] = auVar1[6];
      auVar12._12_4_ = auVar13._12_4_;
      auVar12._0_11_ = auVar1._0_11_;
      auVar12[0xb] = auVar1[5];
      auVar11._11_5_ = auVar12._11_5_;
      auVar11._0_10_ = auVar1._0_10_;
      auVar11[10] = auVar1[5];
      auVar10._10_6_ = auVar11._10_6_;
      auVar10._0_9_ = auVar1._0_9_;
      auVar10[9] = auVar1[4];
      auVar9._9_7_ = auVar10._9_7_;
      auVar9._0_8_ = auVar1._0_8_;
      auVar9[8] = auVar1[4];
      auVar24._0_14_ = auVar47._0_14_;
      auVar24[0xe] = auVar47[7];
      auVar24[0xf] = auVar47[7];
      auVar23._14_2_ = auVar24._14_2_;
      auVar23._0_13_ = auVar47._0_13_;
      auVar23[0xd] = auVar47[6];
      auVar22._13_3_ = auVar23._13_3_;
      auVar22._0_12_ = auVar47._0_12_;
      auVar22[0xc] = auVar47[6];
      auVar21._12_4_ = auVar22._12_4_;
      auVar21._0_11_ = auVar47._0_11_;
      auVar21[0xb] = auVar47[5];
      auVar20._11_5_ = auVar21._11_5_;
      auVar20._0_10_ = auVar47._0_10_;
      auVar20[10] = auVar47[5];
      auVar19._10_6_ = auVar20._10_6_;
      auVar19._0_9_ = auVar47._0_9_;
      auVar19[9] = auVar47[4];
      auVar18._9_7_ = auVar19._9_7_;
      auVar18._0_8_ = auVar47._0_8_;
      auVar18[8] = auVar47[4];
      bVar16 = auVar47[0] * auVar1[0];
      bVar26 = auVar47[1] * auVar1[1];
      bVar28 = auVar47[2] * auVar1[2];
      bVar31 = auVar47[3] * auVar1[3];
      uVar33 = auVar18._8_2_ * auVar9._8_2_;
      uVar35 = auVar20._10_2_ * auVar11._10_2_;
      uVar37 = auVar22._12_2_ * auVar13._12_2_;
      uVar17 = (ushort)bVar16;
      uVar27 = (ushort)bVar26;
      uVar29 = (ushort)bVar28;
      uVar32 = (ushort)bVar31;
      uVar34 = uVar33 & 0xff;
      uVar36 = uVar35 & 0xff;
      uVar38 = uVar37 & 0xff;
      uVar39 = auVar23._14_2_ * auVar14._14_2_ & 0xff;
      fVar25._0_1_ = ((uVar17 != 0) * (uVar17 < 0x100) * bVar16 - (0xff < uVar17)) + *(char *)pfVar6
      ;
      fVar25._1_1_ = ((uVar27 != 0) * (uVar27 < 0x100) * bVar26 - (0xff < uVar27)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1);
      fVar25._2_1_ = ((uVar29 != 0) * (uVar29 < 0x100) * bVar28 - (0xff < uVar29)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2);
      fVar25._3_1_ = ((uVar32 != 0) * (uVar32 < 0x100) * bVar31 - (0xff < uVar32)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3);
      fVar25._4_1_ = ((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar33 - (0xff < uVar34)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      fVar25._5_1_ = ((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar35 - (0xff < uVar36)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5);
      fVar25._6_1_ = ((uVar38 != 0) * (uVar38 < 0x100) * (char)uVar37 - (0xff < uVar38)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6);
      fVar25._7_1_ = ((uVar39 != 0) * (uVar39 < 0x100) * (char)(auVar23._14_2_ * auVar14._14_2_) -
                     (0xff < uVar39)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7);
      fVar25._8_1_ = ((uVar50 != 0) * (uVar50 < 0x100) * (char)uVar49 - (0xff < uVar50)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      fVar25._9_1_ = ((uVar58 != 0) * (uVar58 < 0x100) * (char)uVar57 - (0xff < uVar58)) +
                     *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9);
      fVar25._10_1_ =
           ((uVar60 != 0) * (uVar60 < 0x100) * (char)uVar59 - (0xff < uVar60)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10);
      fVar25._11_1_ =
           ((uVar62 != 0) * (uVar62 < 0x100) * (char)uVar61 - (0xff < uVar62)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb);
      fVar25._12_1_ =
           ((uVar64 != 0) * (uVar64 < 0x100) * (char)uVar63 - (0xff < uVar64)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      fVar25._13_1_ =
           ((uVar66 != 0) * (uVar66 < 0x100) * (char)uVar65 - (0xff < uVar66)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd);
      fVar25._14_1_ =
           ((uVar68 != 0) * (uVar68 < 0x100) * (char)uVar67 - (0xff < uVar68)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe);
      fVar25._15_1_ =
           ((uVar70 != 0) * (uVar70 < 0x100) * (char)uVar69 - (0xff < uVar70)) +
           *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf);
      break;
    case 1:
      fVar25._0_2_ = *(short *)pfVar8 * *(short *)pfVar7 + *(short *)pfVar6;
      fVar25._2_2_ = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2) *
                     *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2) +
                     *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2);
      fVar25._4_2_ = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) *
                     *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4) +
                     *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      fVar25._6_2_ = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6) *
                     *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6) +
                     *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6);
      fVar25._8_2_ = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) *
                     *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) +
                     *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      fVar25._10_2_ =
           *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10) *
           *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10) +
           *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10);
      fVar25._12_2_ =
           *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) *
           *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc) +
           *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      fVar25._14_2_ =
           *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe) *
           *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe) +
           *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe);
      break;
    case 2:
      auVar1 = *(undefined1 (*) [16])&pfVar8->fd;
      iVar30 = auVar1._4_4_;
      auVar47._4_4_ = iVar30;
      auVar47._0_4_ = iVar30;
      auVar47._8_4_ = auVar1._12_4_;
      auVar47._12_4_ = auVar1._12_4_;
      fVar25._0_4_ = auVar1._0_4_ * pfVar7->fs[0] + pfVar6->fs[0];
      fVar25._4_4_ = iVar30 * *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4) +
                     *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4);
      fVar25._8_4_ = (int)((auVar1._8_8_ & 0xffffffff) *
                          (ulong)*(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8)) +
                     *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8);
      fVar25._12_4_ =
           (int)((auVar47._8_8_ & 0xffffffff) *
                (ulong)*(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc)) +
           *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc);
      break;
    case 3:
      uVar2 = pfVar7->fd;
      uVar3 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      uVar4 = pfVar8->fd;
      uVar5 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      fVar25._0_8_ = (uVar4 & 0xffffffff) * (uVar2 & 0xffffffff) + pfVar6->fd +
                     ((uVar2 >> 0x20) * (uVar4 & 0xffffffff) +
                      (uVar4 >> 0x20) * (uVar2 & 0xffffffff) << 0x20);
      fVar25._8_8_ = (uVar5 & 0xffffffff) * (uVar3 & 0xffffffff) +
                     *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) +
                     ((uVar3 >> 0x20) * (uVar5 & 0xffffffff) +
                      (uVar5 >> 0x20) * (uVar3 & 0xffffffff) << 0x20);
    }
    *pfVar6 = fVar25;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x1395,
                "void helper_msa_maddv_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

MSA_TEROP_DF(maddv)
MSA_TEROP_DF(msubv)
MSA_TEROP_DF(dpadd_s)
MSA_TEROP_DF(dpadd_u)
MSA_TEROP_DF(dpsub_s)
MSA_TEROP_DF(dpsub_u)
MSA_TEROP_DF(binsl)
MSA_TEROP_DF(binsr)
MSA_TEROP_DF(madd_q)
MSA_TEROP_DF(msub_q)
MSA_TEROP_DF(maddr_q)
MSA_TEROP_DF(msubr_q)
#undef MSA_TEROP_DF

static inline void msa_splat_df(uint32_t df, wr_t *pwd,
                                wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = pws->b[n];
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = pws->h[n];
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = pws->w[n];
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = pws->d[n];
        }
       break;
    default:
        assert(0);
    }
}